

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvisualmatrix.cpp
# Opt level: O0

void VisualMatrix<std::complex<float>>(TPZFMatrix<std::complex<float>_> *matrix,string *outfilename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *in_RSI;
  int filelength;
  int posvtk;
  int posdx;
  string *in_stack_00000288;
  TPZFMatrix<std::complex<float>_> *in_stack_00000290;
  string *in_stack_000002c8;
  TPZFMatrix<std::complex<float>_> *in_stack_000002d0;
  
  iVar1 = std::__cxx11::string::rfind(in_RSI,0x20c130e);
  iVar2 = std::__cxx11::string::rfind(in_RSI,0x209a499);
  iVar3 = std::__cxx11::string::size();
  if (iVar3 - iVar1 == 3) {
    VisualMatrixDX<std::complex<float>>(in_stack_000002d0,in_stack_000002c8);
  }
  else if (iVar3 - iVar2 == 4) {
    VisualMatrixVTK<std::complex<float>>(in_stack_00000290,in_stack_00000288);
  }
  else {
    std::operator<<((ostream *)&std::cout,"visualmatrix output was not created\n");
  }
  return;
}

Assistant:

void VisualMatrix(TPZFMatrix<TVar> & matrix, const std::string &outfilename)
{
	int posdx = outfilename.rfind(".dx");
	int posvtk = outfilename.rfind(".vtk");
	int filelength = outfilename.size();
	if(filelength-posdx == 3) {
		VisualMatrixDX(matrix,outfilename);
	} else if(filelength-posvtk == 4) {
		VisualMatrixVTK(matrix,outfilename);
	} else {
		cout << "visualmatrix output was not created\n";
	}
}